

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar_pidd.hpp
# Opt level: O2

void __thiscall astar_pidd::AStarPIDD<Tiles>::AStarPIDD(AStarPIDD<Tiles> *this,Tiles *d)

{
  ostream *poVar1;
  
  (this->super_SearchAlg<Tiles>).dom = d;
  (this->super_SearchAlg<Tiles>).expd = 0;
  (this->super_SearchAlg<Tiles>).gend = 0;
  (this->super_SearchAlg<Tiles>)._vptr_SearchAlg = (_func_int **)&PTR_search_0011ba40;
  compress::CompressClosedListAsync<Node<Tiles>_>::CompressClosedListAsync
            (&this->closed,true,true,true,0x3b600000);
  compress::CompressOpenList<Node<Tiles>_>::CompressOpenList(&this->open);
  (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->duplicates = 0;
  (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::operator<<(poVar1," concurrent threads are supported.\n");
  return;
}

Assistant:

AStarPIDD(Domain &d) : SearchAlg<Domain>(d),
            closed(true, true, true, 950_MiB), // TODO: move to user option
            open() {
            std::cout << N_THREADS << " concurrent threads are supported.\n";
        }